

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

aiMesh * Assimp::MakeSubmesh(aiMesh *pMesh,
                            vector<unsigned_int,_std::allocator<unsigned_int>_> *subMeshFaces,
                            uint subFlags)

{
  aiColor4D *paVar1;
  int *piVar2;
  float fVar3;
  aiVector3D *paVar4;
  aiBone *paVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  aiMesh *paVar22;
  ulong uVar23;
  aiVector3D *paVar24;
  aiColor4D *paVar25;
  ulong *puVar26;
  uint *puVar27;
  aiBone **__s;
  aiBone *paVar28;
  aiVertexWeight *paVar29;
  aiFace *paVar30;
  uint uVar31;
  uint uVar32;
  aiFace *paVar33;
  ulong uVar34;
  aiColor4D **ppaVar35;
  ulong uVar36;
  uint n;
  long lVar37;
  long lVar38;
  size_t a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vMap;
  uint local_b8;
  allocator_type local_b1;
  aiVector3D **local_b0;
  aiColor4D **local_a8;
  aiMesh *local_a0;
  ulong local_98;
  value_type_conflict4 local_8c;
  pointer local_88;
  pointer local_80;
  ulong local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  paVar22 = (aiMesh *)operator_new(0x520);
  paVar22->mPrimitiveTypes = 0;
  paVar22->mNumVertices = 0;
  uVar34 = 0;
  paVar22->mNumFaces = 0;
  local_b0 = &paVar22->mVertices;
  memset(local_b0,0,0xcc);
  paVar22->mBones = (aiBone **)0x0;
  paVar22->mMaterialIndex = 0;
  (paVar22->mName).length = 0;
  (paVar22->mName).data[0] = '\0';
  memset((paVar22->mName).data + 1,0x1b,0x3ff);
  paVar22->mNumAnimMeshes = 0;
  paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar22->mMethod = 0;
  (paVar22->mAABB).mMin.x = 0.0;
  (paVar22->mAABB).mMin.y = 0.0;
  (paVar22->mAABB).mMin.z = 0.0;
  (paVar22->mAABB).mMax.x = 0.0;
  (paVar22->mAABB).mMax.y = 0.0;
  (paVar22->mAABB).mMax.z = 0.0;
  local_a8 = paVar22->mColors;
  memset(local_a8,0,0xa0);
  local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_58,(ulong)pMesh->mNumVertices,(value_type_conflict4 *)&local_70,
             (allocator_type *)&local_8c);
  local_88 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
  local_80 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
  local_78 = (long)local_80 - (long)local_88 >> 2;
  local_40 = (long)local_80 - (long)local_88;
  if (local_40 != 0) {
    uVar23 = 0;
    uVar34 = 0;
    do {
      uVar32 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar23];
      uVar31 = pMesh->mFaces[uVar32].mNumIndices;
      if (uVar31 != 0) {
        paVar30 = pMesh->mFaces + uVar32;
        uVar36 = 0;
        do {
          uVar32 = paVar30->mIndices[uVar36];
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar32] == 0xffffffff) {
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar32] = (uint)uVar34;
            uVar34 = uVar34 + 1;
            uVar31 = paVar30->mNumIndices;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < uVar31);
      }
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < local_78);
  }
  if (paVar22 != pMesh) {
    uVar32 = (pMesh->mName).length;
    (paVar22->mName).length = uVar32;
    memcpy((paVar22->mName).data,(pMesh->mName).data,(ulong)uVar32);
    (paVar22->mName).data[uVar32] = '\0';
  }
  paVar22->mMaterialIndex = pMesh->mMaterialIndex;
  paVar22->mPrimitiveTypes = pMesh->mPrimitiveTypes;
  paVar22->mNumFaces =
       (uint)((ulong)((long)(subMeshFaces->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(subMeshFaces->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  paVar22->mNumVertices = (uint)uVar34;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar34;
  uVar36 = SUB168(auVar6 * ZEXT816(0xc),0);
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0xc),8) == 0) {
    uVar23 = uVar36;
  }
  local_38 = subMeshFaces;
  paVar24 = (aiVector3D *)operator_new__(uVar23);
  if (uVar34 != 0) {
    memset(paVar24,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
  }
  *local_b0 = paVar24;
  local_b8 = pMesh->mNumVertices;
  if (local_b8 != 0 && pMesh->mNormals != (aiVector3D *)0x0) {
    paVar24 = (aiVector3D *)operator_new__(uVar23);
    if (uVar34 != 0) {
      memset(paVar24,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar22->mNormals = paVar24;
  }
  if ((pMesh->mBitangents == (aiVector3D *)0x0 || pMesh->mTangents == (aiVector3D *)0x0) ||
      local_b8 == 0) {
    if (local_b8 != 0) goto LAB_003aa6bb;
  }
  else {
    paVar24 = (aiVector3D *)operator_new__(uVar23);
    if (uVar34 != 0) {
      memset(paVar24,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar22->mTangents = paVar24;
    paVar24 = (aiVector3D *)operator_new__(uVar23);
    if (uVar34 != 0) {
      memset(paVar24,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar22->mBitangents = paVar24;
LAB_003aa6bb:
    local_98 = ((uVar36 - 0xc) / 0xc) * 0xc + 0xc;
    lVar38 = 0;
    do {
      if (pMesh->mTextureCoords[(uint)lVar38 & 7] == (aiVector3D *)0x0) break;
      paVar24 = (aiVector3D *)operator_new__(uVar23);
      if (uVar34 != 0) {
        memset(paVar24,0,local_98);
      }
      paVar22->mTextureCoords[lVar38] = paVar24;
      paVar22->mNumUVComponents[lVar38] = pMesh->mNumUVComponents[lVar38];
      lVar38 = lVar38 + 1;
    } while (lVar38 != 8);
    if (local_b8 != 0) {
      local_98 = uVar34 << 4;
      uVar23 = -(ulong)(uVar34 >> 0x3c != 0) | local_98;
      lVar38 = 0;
      do {
        if (pMesh->mColors[(uint)lVar38 & 7] == (aiColor4D *)0x0) break;
        paVar25 = (aiColor4D *)operator_new__(uVar23);
        if (uVar34 != 0) {
          memset(paVar25,0,local_98);
        }
        local_a8[lVar38] = paVar25;
        lVar38 = lVar38 + 1;
      } while (lVar38 != 8);
    }
  }
  puVar26 = (ulong *)operator_new__(local_40 * 4 + 8);
  paVar30 = (aiFace *)(puVar26 + 1);
  *puVar26 = local_78;
  if (local_80 == local_88) {
    paVar22->mFaces = paVar30;
  }
  else {
    paVar33 = paVar30;
    do {
      paVar33->mNumIndices = 0;
      paVar33->mIndices = (uint *)0x0;
      paVar33 = paVar33 + 1;
    } while (paVar33 != paVar30 + local_78);
    paVar22->mFaces = paVar30;
    if (local_80 != local_88) {
      uVar34 = 0;
      local_a0 = paVar22;
      do {
        paVar30 = pMesh->mFaces;
        uVar32 = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar34];
        paVar33 = local_a0->mFaces;
        uVar31 = paVar30[uVar32].mNumIndices;
        paVar33[uVar34].mNumIndices = uVar31;
        puVar27 = (uint *)operator_new__((ulong)uVar31 << 2);
        paVar33 = paVar33 + uVar34;
        paVar33->mIndices = puVar27;
        if (paVar33->mNumIndices != 0) {
          uVar23 = 0;
          do {
            paVar33->mIndices[uVar23] =
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[paVar30[uVar32].mIndices[uVar23]];
            uVar23 = uVar23 + 1;
          } while (uVar23 < paVar33->mNumIndices);
        }
        uVar34 = (ulong)((int)uVar34 + 1);
      } while (uVar34 < local_78);
      local_b8 = pMesh->mNumVertices;
      paVar22 = local_a0;
    }
  }
  if (local_b8 != 0) {
    uVar34 = 0;
    do {
      uVar23 = (ulong)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar34];
      if (uVar23 != 0xffffffff) {
        paVar24 = pMesh->mVertices;
        paVar4 = *local_b0;
        paVar4[uVar23].z = paVar24[uVar34].z;
        paVar24 = paVar24 + uVar34;
        fVar3 = paVar24->y;
        paVar4 = paVar4 + uVar23;
        paVar4->x = paVar24->x;
        paVar4->y = fVar3;
        paVar24 = pMesh->mNormals;
        if ((paVar24 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
          paVar4 = paVar22->mNormals;
          paVar4[uVar23].z = paVar24[uVar34].z;
          fVar3 = paVar24[uVar34].y;
          paVar4 = paVar4 + uVar23;
          paVar4->x = paVar24[uVar34].x;
          paVar4->y = fVar3;
        }
        paVar24 = pMesh->mTangents;
        if (((paVar24 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
           (pMesh->mNumVertices != 0)) {
          paVar4 = paVar22->mTangents;
          paVar4[uVar23].z = paVar24[uVar34].z;
          fVar3 = paVar24[uVar34].y;
          paVar4 = paVar4 + uVar23;
          paVar4->x = paVar24[uVar34].x;
          paVar4->y = fVar3;
          paVar24 = pMesh->mBitangents;
          paVar4 = paVar22->mBitangents;
          paVar4[uVar23].z = paVar24[uVar34].z;
          paVar24 = paVar24 + uVar34;
          fVar3 = paVar24->y;
          paVar4 = paVar4 + uVar23;
          paVar4->x = paVar24->x;
          paVar4->y = fVar3;
        }
        lVar38 = 0;
        do {
          if (pMesh->mTextureCoords[lVar38] == (aiVector3D *)0x0) {
            if (lVar38 == 0) goto LAB_003aa9e5;
            goto LAB_003aa9bf;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 8);
        lVar38 = 8;
LAB_003aa9bf:
        lVar37 = 0;
        do {
          paVar24 = pMesh->mTextureCoords[lVar37];
          paVar4 = paVar22->mTextureCoords[lVar37];
          paVar4[uVar23].z = paVar24[uVar34].z;
          paVar24 = paVar24 + uVar34;
          fVar3 = paVar24->y;
          paVar4 = paVar4 + uVar23;
          paVar4->x = paVar24->x;
          paVar4->y = fVar3;
          lVar37 = lVar37 + 1;
        } while (lVar38 != lVar37);
LAB_003aa9e5:
        lVar38 = 0;
        do {
          if (pMesh->mColors[lVar38] == (aiColor4D *)0x0) {
            if (lVar38 == 0) goto LAB_003aaa3b;
            goto LAB_003aaa12;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 8);
        lVar38 = 8;
LAB_003aaa12:
        lVar37 = 0;
        do {
          paVar25 = pMesh->mColors[lVar37] + uVar34;
          fVar3 = paVar25->g;
          fVar8 = paVar25->b;
          fVar9 = paVar25->a;
          paVar1 = local_a8[lVar37] + uVar23;
          paVar1->r = paVar25->r;
          paVar1->g = fVar3;
          paVar1->b = fVar8;
          paVar1->a = fVar9;
          lVar37 = lVar37 + 1;
        } while (lVar38 != lVar37);
      }
LAB_003aaa3b:
      uVar34 = uVar34 + 1;
    } while (uVar34 < pMesh->mNumVertices);
  }
  if ((subFlags & 1) == 0) {
    local_8c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_70,(ulong)pMesh->mNumBones,&local_8c,&local_b1);
    uVar32 = pMesh->mNumBones;
    bVar7 = true;
    if (uVar32 != 0) {
      uVar34 = 0;
      do {
        paVar5 = pMesh->mBones[uVar34];
        uVar23 = (ulong)paVar5->mNumWeights;
        if (paVar5->mNumWeights != 0) {
          uVar36 = 0;
          do {
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[paVar5->mWeights[uVar36].mVertexId] != 0xffffffff)
            {
              piVar2 = (int *)(CONCAT44(local_70.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_70.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              uVar34 * 4);
              *piVar2 = *piVar2 + 1;
              uVar23 = (ulong)paVar5->mNumWeights;
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 < uVar23);
          uVar32 = pMesh->mNumBones;
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 < uVar32);
      if (uVar32 != 0) {
        uVar34 = 0;
        do {
          if (*(int *)(CONCAT44(local_70.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_70.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar34 * 4) != 0)
          {
            paVar22->mNumBones = paVar22->mNumBones + 1;
          }
          uVar34 = uVar34 + 1;
          bVar7 = uVar32 == 0;
        } while (uVar32 != uVar34);
      }
    }
    local_b0 = (aiVector3D **)(ulong)paVar22->mNumBones;
    if (local_b0 != (aiVector3D **)0x0) {
      uVar34 = (long)local_b0 * 8;
      __s = (aiBone **)operator_new__(uVar34);
      memset(__s,0,uVar34);
      paVar22->mBones = __s;
      paVar22->mNumBones = 0;
      if (bVar7) {
LAB_003aad50:
        __assert_fail("nbParanoia==oMesh->mNumBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                      ,0x1b3,
                      "aiMesh *Assimp::MakeSubmesh(const aiMesh *, const std::vector<unsigned int> &, unsigned int)"
                     );
      }
      ppaVar35 = (aiColor4D **)0x0;
      local_a0 = paVar22;
      do {
        if (*(int *)(CONCAT44(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) + (long)ppaVar35 * 4)
            != 0) {
          paVar28 = (aiBone *)operator_new(0x450);
          (paVar28->mName).length = 0;
          (paVar28->mName).data[0] = '\0';
          memset((paVar28->mName).data + 1,0x1b,0x3ff);
          paVar28->mNumWeights = 0;
          paVar28->mWeights = (aiVertexWeight *)0x0;
          (paVar28->mOffsetMatrix).a1 = 1.0;
          (paVar28->mOffsetMatrix).a2 = 0.0;
          (paVar28->mOffsetMatrix).a3 = 0.0;
          (paVar28->mOffsetMatrix).a4 = 0.0;
          (paVar28->mOffsetMatrix).b1 = 0.0;
          (paVar28->mOffsetMatrix).b2 = 1.0;
          (paVar28->mOffsetMatrix).b3 = 0.0;
          (paVar28->mOffsetMatrix).b4 = 0.0;
          (paVar28->mOffsetMatrix).c1 = 0.0;
          (paVar28->mOffsetMatrix).c2 = 0.0;
          (paVar28->mOffsetMatrix).c3 = 1.0;
          (paVar28->mOffsetMatrix).c4 = 0.0;
          (paVar28->mOffsetMatrix).d1 = 0.0;
          (paVar28->mOffsetMatrix).d2 = 0.0;
          (paVar28->mOffsetMatrix).d3 = 0.0;
          (paVar28->mOffsetMatrix).d4 = 1.0;
          uVar32 = paVar22->mNumBones;
          paVar22->mNumBones = uVar32 + 1;
          paVar22->mBones[uVar32] = paVar28;
          paVar5 = pMesh->mBones[(long)ppaVar35];
          if (paVar28 != paVar5) {
            uVar32 = (paVar5->mName).length;
            (paVar28->mName).length = uVar32;
            memcpy((paVar28->mName).data,(paVar5->mName).data,(ulong)uVar32);
            (paVar28->mName).data[uVar32] = '\0';
          }
          fVar18 = (paVar5->mOffsetMatrix).a1;
          fVar19 = (paVar5->mOffsetMatrix).a2;
          fVar20 = (paVar5->mOffsetMatrix).a3;
          fVar21 = (paVar5->mOffsetMatrix).a4;
          fVar14 = (paVar5->mOffsetMatrix).b1;
          fVar15 = (paVar5->mOffsetMatrix).b2;
          fVar16 = (paVar5->mOffsetMatrix).b3;
          fVar17 = (paVar5->mOffsetMatrix).b4;
          fVar10 = (paVar5->mOffsetMatrix).c1;
          fVar11 = (paVar5->mOffsetMatrix).c2;
          fVar12 = (paVar5->mOffsetMatrix).c3;
          fVar13 = (paVar5->mOffsetMatrix).c4;
          fVar3 = (paVar5->mOffsetMatrix).d2;
          fVar8 = (paVar5->mOffsetMatrix).d3;
          fVar9 = (paVar5->mOffsetMatrix).d4;
          (paVar28->mOffsetMatrix).d1 = (paVar5->mOffsetMatrix).d1;
          (paVar28->mOffsetMatrix).d2 = fVar3;
          (paVar28->mOffsetMatrix).d3 = fVar8;
          (paVar28->mOffsetMatrix).d4 = fVar9;
          (paVar28->mOffsetMatrix).c1 = fVar10;
          (paVar28->mOffsetMatrix).c2 = fVar11;
          (paVar28->mOffsetMatrix).c3 = fVar12;
          (paVar28->mOffsetMatrix).c4 = fVar13;
          (paVar28->mOffsetMatrix).b1 = fVar14;
          (paVar28->mOffsetMatrix).b2 = fVar15;
          (paVar28->mOffsetMatrix).b3 = fVar16;
          (paVar28->mOffsetMatrix).b4 = fVar17;
          (paVar28->mOffsetMatrix).a1 = fVar18;
          (paVar28->mOffsetMatrix).a2 = fVar19;
          (paVar28->mOffsetMatrix).a3 = fVar20;
          (paVar28->mOffsetMatrix).a4 = fVar21;
          uVar32 = *(uint *)(CONCAT44(local_70.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_70.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                            (long)ppaVar35 * 4);
          uVar34 = (ulong)uVar32 * 8;
          local_a8 = ppaVar35;
          paVar29 = (aiVertexWeight *)operator_new__(uVar34);
          if (uVar32 != 0) {
            memset(paVar29,0,uVar34);
          }
          paVar28->mWeights = paVar29;
          uVar32 = paVar5->mNumWeights;
          ppaVar35 = local_a8;
          paVar22 = local_a0;
          if (uVar32 != 0) {
            uVar34 = 0;
            do {
              uVar31 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[paVar5->mWeights[uVar34].mVertexId];
              if (uVar31 != 0xffffffff) {
                fVar3 = paVar5->mWeights[uVar34].mWeight;
                paVar29 = paVar28->mWeights;
                uVar32 = paVar28->mNumWeights;
                paVar28->mNumWeights = uVar32 + 1;
                paVar29[uVar32].mVertexId = uVar31;
                paVar29[uVar32].mWeight = fVar3;
                uVar32 = paVar5->mNumWeights;
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 < uVar32);
          }
        }
        ppaVar35 = (aiColor4D **)((long)ppaVar35 + 1);
      } while (ppaVar35 < (undefined1 *)(ulong)pMesh->mNumBones);
      if ((uint)local_b0 != paVar22->mNumBones) goto LAB_003aad50;
    }
    if ((void *)CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_70.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_70.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
  }
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return paVar22;
}

Assistant:

aiMesh* MakeSubmesh(const aiMesh *pMesh, const std::vector<unsigned int> &subMeshFaces, unsigned int subFlags)
{
    aiMesh *oMesh = new aiMesh();
    std::vector<unsigned int> vMap(pMesh->mNumVertices,UINT_MAX);

    size_t numSubVerts = 0;
    size_t numSubFaces = subMeshFaces.size();

    for(unsigned int i=0;i<numSubFaces;i++) {
        const aiFace &f = pMesh->mFaces[subMeshFaces[i]];

        for(unsigned int j=0;j<f.mNumIndices;j++)   {
            if(vMap[f.mIndices[j]]==UINT_MAX)   {
                vMap[f.mIndices[j]] = static_cast<unsigned int>(numSubVerts++);
            }
        }
    }

    oMesh->mName = pMesh->mName;

    oMesh->mMaterialIndex = pMesh->mMaterialIndex;
    oMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;

    // create all the arrays for this mesh if the old mesh contained them

    oMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
    oMesh->mNumVertices = static_cast<unsigned int>(numSubVerts);
    oMesh->mVertices = new aiVector3D[numSubVerts];
    if( pMesh->HasNormals() ) {
        oMesh->mNormals = new aiVector3D[numSubVerts];
    }

    if( pMesh->HasTangentsAndBitangents() ) {
        oMesh->mTangents = new aiVector3D[numSubVerts];
        oMesh->mBitangents = new aiVector3D[numSubVerts];
    }

    for( size_t a = 0;  pMesh->HasTextureCoords(static_cast<unsigned int>(a)) ; ++a ) {
        oMesh->mTextureCoords[a] = new aiVector3D[numSubVerts];
        oMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
    }

    for( size_t a = 0; pMesh->HasVertexColors( static_cast<unsigned int>(a)); ++a )    {
        oMesh->mColors[a] = new aiColor4D[numSubVerts];
    }

    // and copy over the data, generating faces with linear indices along the way
    oMesh->mFaces = new aiFace[numSubFaces];

    for(unsigned int a = 0; a < numSubFaces; ++a )  {

        const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
        aiFace& dstFace = oMesh->mFaces[a];
        dstFace.mNumIndices = srcFace.mNumIndices;
        dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

        // accumulate linearly all the vertices of the source face
        for( size_t b = 0; b < dstFace.mNumIndices; ++b )   {
            dstFace.mIndices[b] = vMap[srcFace.mIndices[b]];
        }
    }

    for(unsigned int srcIndex = 0; srcIndex < pMesh->mNumVertices; ++srcIndex ) {
        unsigned int nvi = vMap[srcIndex];
        if(nvi==UINT_MAX) {
            continue;
        }

        oMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
        if( pMesh->HasNormals() ) {
            oMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
        }

        if( pMesh->HasTangentsAndBitangents() ) {
            oMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
            oMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumUVChannels(); c < cc; ++c )    {
                oMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumColorChannels(); c < cc; ++c ) {
            oMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
        }
    }

    if(~subFlags&AI_SUBMESH_FLAGS_SANS_BONES)   {
        std::vector<unsigned int> subBones(pMesh->mNumBones,0);

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            const aiBone* bone = pMesh->mBones[a];

            for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                unsigned int v = vMap[bone->mWeights[b].mVertexId];

                if(v!=UINT_MAX) {
                    subBones[a]++;
                }
            }
        }

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            if(subBones[a]>0) {
                oMesh->mNumBones++;
            }
        }

        if(oMesh->mNumBones) {
            oMesh->mBones = new aiBone*[oMesh->mNumBones]();
            unsigned int nbParanoia = oMesh->mNumBones;

            oMesh->mNumBones = 0; //rewind

            for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
                if(subBones[a]==0) {
                    continue;
                }
                aiBone *newBone = new aiBone;
                oMesh->mBones[oMesh->mNumBones++] = newBone;

                const aiBone* bone = pMesh->mBones[a];

                newBone->mName = bone->mName;
                newBone->mOffsetMatrix = bone->mOffsetMatrix;
                newBone->mWeights = new aiVertexWeight[subBones[a]];

                for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                    const unsigned int v = vMap[bone->mWeights[b].mVertexId];

                    if(v!=UINT_MAX) {
                        aiVertexWeight w(v,bone->mWeights[b].mWeight);
                        newBone->mWeights[newBone->mNumWeights++] = w;
                    }
                }
            }

            ai_assert(nbParanoia==oMesh->mNumBones);
            (void)nbParanoia; // remove compiler warning on release build
        }
    }

    return oMesh;
}